

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qobject.cpp
# Opt level: O1

bool __thiscall QObject::doSetProperty(QObject *this,char *name,QVariant *lvalue,QVariant *rvalue)

{
  QList<QVariant> *this_00;
  QObjectData *pQVar1;
  QList<QByteArray> *this_01;
  bool bVar2;
  undefined1 uVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  undefined4 extraout_var;
  ssize_t sVar7;
  _func_int **pp_Var8;
  qsizetype qVar9;
  pointer pQVar10;
  QVariant *pQVar11;
  size_t __n;
  long lVar12;
  long in_FS_OFFSET;
  QDynamicPropertyChangeEvent ev;
  QByteArray local_80;
  undefined1 local_68 [16];
  QMetaObject *local_58;
  Data DStack_50;
  undefined1 *local_48;
  char *local_40;
  long local_38;
  QMetaObject *this_02;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = (this->d_ptr).d;
  pQVar11 = rvalue;
  local_40 = name;
  iVar4 = (**this->_vptr_QObject)();
  this_02 = (QMetaObject *)CONCAT44(extraout_var,iVar4);
  __n = CONCAT71((int7)((ulong)pQVar11 >> 8),
                 this_02 == (QMetaObject *)0x0 || local_40 == (char *)0x0);
  if (this_02 != (QMetaObject *)0x0 && local_40 != (char *)0x0) {
    iVar4 = QMetaObject::indexOfProperty(this_02,local_40);
    if (-1 < iVar4) {
      local_58 = (QMetaObject *)&DAT_aaaaaaaaaaaaaaaa;
      DStack_50.d = (uint *)&DAT_aaaaaaaaaaaaaaaa;
      local_68._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_68._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      QMetaObject::property((QMetaProperty *)local_68,this_02,iVar4);
      if (rvalue == (QVariant *)0x0) {
        sVar7 = QMetaProperty::write((QMetaProperty *)local_68,(int)this,lvalue,__n);
        uVar3 = (undefined1)sVar7;
      }
      else {
        sVar7 = QMetaProperty::write((QMetaProperty *)local_68,(int)this,rvalue,__n);
        uVar3 = (undefined1)sVar7;
      }
      goto LAB_002bb41f;
    }
    if (pQVar1[1]._vptr_QObjectData == (_func_int **)0x0) {
      pp_Var8 = (_func_int **)operator_new(0x80);
      *pp_Var8 = (_func_int *)0x0;
      pp_Var8[1] = (_func_int *)0x0;
      pp_Var8[2] = (_func_int *)0x0;
      pp_Var8[3] = (_func_int *)0x0;
      pp_Var8[4] = (_func_int *)0x0;
      pp_Var8[5] = (_func_int *)0x0;
      pp_Var8[6] = (_func_int *)0x0;
      pp_Var8[7] = (_func_int *)0x0;
      pp_Var8[8] = (_func_int *)0x0;
      pp_Var8[9] = (_func_int *)0x0;
      pp_Var8[10] = (_func_int *)0x0;
      pp_Var8[0xb] = (_func_int *)0x0;
      pp_Var8[0xc] = (_func_int *)0x0;
      pp_Var8[0xd] = (_func_int *)0x0;
      pp_Var8[0xe] = (_func_int *)0x0;
      pp_Var8[0xf] = (_func_int *)pQVar1;
      pQVar1[1]._vptr_QObjectData = pp_Var8;
    }
    qVar9 = QtPrivate::indexOf<QByteArray,char_const*>
                      ((QList<QByteArray> *)pQVar1[1]._vptr_QObjectData,&local_40,0);
    iVar4 = (int)qVar9;
    if (*(ulong *)&(lvalue->d).field_0x18 < 4) {
      if (iVar4 == -1) goto LAB_002bb41d;
      QList<QByteArray>::removeAt((QList<QByteArray> *)pQVar1[1]._vptr_QObjectData,(long)iVar4);
      QList<QVariant>::removeAt((QList<QVariant> *)(pQVar1[1]._vptr_QObjectData + 3),(long)iVar4);
    }
    else if (iVar4 == -1) {
      this_01 = (QList<QByteArray> *)pQVar1[1]._vptr_QObjectData;
      QByteArray::QByteArray((QByteArray *)local_68,local_40,-1);
      QtPrivate::QMovableArrayOps<QByteArray>::emplace<QByteArray>
                ((QMovableArrayOps<QByteArray> *)this_01,(this_01->d).size,(QByteArray *)local_68);
      QList<QByteArray>::end(this_01);
      if ((QArrayData *)local_68._0_8_ != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)local_68._0_8_)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)local_68._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)local_68._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)local_68._0_8_,1,0x10);
        }
      }
      this_00 = (QList<QVariant> *)(pQVar1[1]._vptr_QObjectData + 3);
      if (rvalue == (QVariant *)0x0) {
        QList<QVariant>::append(this_00,lvalue);
      }
      else {
        QtPrivate::QMovableArrayOps<QVariant>::emplace<QVariant>
                  ((QMovableArrayOps<QVariant> *)this_00,(qsizetype)pQVar1[1]._vptr_QObjectData[5],
                   rvalue);
        QList<QVariant>::end(this_00);
      }
    }
    else {
      iVar5 = ::QVariant::typeId(lvalue);
      lVar12 = (long)iVar4 * 0x20;
      iVar6 = ::QVariant::typeId((QVariant *)(pQVar1[1]._vptr_QObjectData[4] + lVar12));
      if ((iVar5 == iVar6) &&
         (bVar2 = ::QVariant::equals(lvalue,(QVariant *)(pQVar1[1]._vptr_QObjectData[4] + lVar12)),
         bVar2)) goto LAB_002bb41d;
      pQVar10 = QList<QVariant>::data((QList<QVariant> *)(pQVar1[1]._vptr_QObjectData + 3));
      if (rvalue == (QVariant *)0x0) {
        ::QVariant::operator=(pQVar10 + iVar4,lvalue);
      }
      else {
        ::QVariant::operator=(pQVar10 + iVar4,rvalue);
      }
    }
    local_48 = &DAT_aaaaaaaaaaaaaaaa;
    local_58 = (QMetaObject *)&DAT_aaaaaaaaaaaaaaaa;
    DStack_50.d = (uint *)&DAT_aaaaaaaaaaaaaaaa;
    local_68._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_68._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    QByteArray::QByteArray(&local_80,local_40,-1);
    QDynamicPropertyChangeEvent::QDynamicPropertyChangeEvent
              ((QDynamicPropertyChangeEvent *)local_68,&local_80);
    if (&(local_80.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_80.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_80.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_80.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_80.d.d)->super_QArrayData,1,0x10);
      }
    }
    QCoreApplication::sendEvent(this,(QEvent *)local_68);
    QDynamicPropertyChangeEvent::~QDynamicPropertyChangeEvent
              ((QDynamicPropertyChangeEvent *)local_68);
  }
LAB_002bb41d:
  uVar3 = 0;
LAB_002bb41f:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return (bool)uVar3;
}

Assistant:

bool QObject::doSetProperty(const char *name, const QVariant *lvalue, QVariant *rvalue)
{
    Q_D(QObject);
    const auto &value =*lvalue;
    const QMetaObject *meta = metaObject();
    if (!name || !meta)
        return false;

    int id = meta->indexOfProperty(name);
    if (id < 0) {
        d->ensureExtraData();

        const int idx = d->extraData->propertyNames.indexOf(name);

        if (!value.isValid()) {
            if (idx == -1)
                return false;
            d->extraData->propertyNames.removeAt(idx);
            d->extraData->propertyValues.removeAt(idx);
        } else {
            if (idx == -1) {
                d->extraData->propertyNames.append(name);
                if (rvalue)
                    d->extraData->propertyValues.append(std::move(*rvalue));
                else
                    d->extraData->propertyValues.append(*lvalue);
            } else {
                if (value.userType() == d->extraData->propertyValues.at(idx).userType()
                        && value == d->extraData->propertyValues.at(idx))
                    return false;
                if (rvalue)
                    d->extraData->propertyValues[idx] = std::move(*rvalue);
                else
                    d->extraData->propertyValues[idx] = *lvalue;
            }
        }

        QDynamicPropertyChangeEvent ev(name);
        QCoreApplication::sendEvent(this, &ev);

        return false;
    }
    QMetaProperty p = meta->property(id);
#ifndef QT_NO_DEBUG
    if (!p.isWritable())
        qWarning("%s::setProperty: Property \"%s\" invalid,"
                 " read-only or does not exist", metaObject()->className(), name);
#endif
    return rvalue ? p.write(this, std::move(*rvalue)) : p.write(this, *lvalue);
}